

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

double __thiscall
chrono::fea::ChElementBeamANCF_3333::GetVonMissesStress
          (ChElementBeamANCF_3333 *this,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChElementBeamANCF_3333 *this_00;
  ResScalar RVar11;
  ResScalar RVar12;
  ResScalar RVar13;
  ResScalar RVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar15;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ChVectorN<double,_6> epsilon_combined;
  ChMatrixNM<double,_3,_3> SPK2;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrix33<double> S;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  double local_540;
  double local_538;
  double local_530;
  ResScalar local_528;
  ResScalar local_520;
  ResScalar local_518;
  double local_510;
  ResScalar local_508;
  ChElementBeamANCF_3333 *local_500;
  undefined1 local_4f8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4e8;
  variable_if_dynamic<long,__1> local_4e0;
  variable_if_dynamic<long,__1> local_4d8;
  undefined1 local_4d0 [32];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_4b0;
  Scalar local_478;
  undefined1 local_470 [32];
  variable_if_dynamic<long,__1> local_450;
  ulong local_448;
  double local_440;
  double local_430;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_428;
  undefined1 local_3f8 [16];
  Matrix<double,_3,_3,_0,_3,_3> *local_3e8;
  Matrix<double,_3,_3,_0,_3,_3> local_3c8;
  undefined1 local_380 [304];
  Matrix<double,_3,_3,_1,_3,_3> local_250;
  MatrixNx3c local_208;
  Matrix<double,_3,_3,_1,_3,_3> *local_130 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  p_Stack_4e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._8_8_;
  Calc_Sxi_D(this,&local_208,xi,eta,zeta);
  local_380._0_8_ = &this->m_ebar0;
  local_500 = this;
  local_380._8_8_ = &local_208;
  local_130[0] = &local_250;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_130,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
              *)local_380);
  local_380._0_8_ = &local_208;
  local_380._8_8_ = &local_250;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_208,
             (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
              *)local_380);
  CalcCoordMatrix(this,(Matrix3xN *)local_130);
  local_380._0_8_ = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_130;
  local_380._8_8_ = &local_208;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_3c8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
              *)local_380);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,0);
  RVar11 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_4f8);
  dVar15 = (RVar11 + -1.0) * 0.5;
  local_540 = dVar15;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,1);
  RVar11 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_4f8);
  dVar7 = (RVar11 + -1.0) * 0.5;
  local_538 = dVar7;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,2);
  RVar11 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_4f8);
  dVar8 = (RVar11 + -1.0) * 0.5;
  local_530 = dVar8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,2);
  RVar11 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_4f8);
  local_528 = RVar11;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,2);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_4f8);
  local_520 = RVar12;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_380,&local_3c8,0);
  this_00 = local_500;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_4f8,&local_3c8,1);
  local_518 = Eigen::internal::
              dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
              ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    local_380,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    local_4f8);
  if (this_00->m_damping_enabled == true) {
    local_508 = local_518;
    CalcCoordDerivMatrix(this_00,(Matrix3xN *)local_380);
    local_470._8_8_ = &local_208;
    local_470._0_8_ =
         (BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)local_380;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_4f8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                *)local_470);
    local_510 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,0);
    auVar22._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_470,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_4b0);
    auVar22._8_56_ = extraout_var;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_510;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar15;
    auVar1 = vfmadd213sd_fma(auVar22._0_16_,auVar25,auVar1);
    local_540 = auVar1._0_8_;
    dVar15 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,1);
    auVar23._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_470,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_4b0);
    auVar23._8_56_ = extraout_var_00;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar15;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar7;
    auVar1 = vfmadd213sd_fma(auVar23._0_16_,auVar26,auVar2);
    local_538 = auVar1._0_8_;
    dVar15 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,2);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,2);
    auVar24._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_470,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_4b0);
    auVar24._8_56_ = extraout_var_01;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar15;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar8;
    auVar1 = vfmadd213sd_fma(auVar24._0_16_,auVar27,auVar3);
    local_530 = auVar1._0_8_;
    dVar15 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,2);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_470,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_4b0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_428,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_3f8,&local_3c8,2);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_428,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_3f8);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar15;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = RVar11;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = RVar14 + RVar13;
    auVar1 = vfmadd213sd_fma(auVar16,auVar28,auVar4);
    local_528 = auVar1._0_8_;
    dVar15 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,2);
    RVar11 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_470,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_4b0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_428,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_3f8,&local_3c8,2);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_428,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_3f8);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar15;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = RVar12;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = RVar13 + RVar11;
    auVar1 = vfmadd213sd_fma(auVar17,auVar29,auVar5);
    local_520 = auVar1._0_8_;
    dVar15 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_470,&local_3c8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4b0,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,1);
    RVar11 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_470,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_4b0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_428,(Matrix<double,_3,_3,_0,_3,_3> *)local_4f8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_3f8,&local_3c8,1);
    RVar12 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_428,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_3f8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar15;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_508;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = RVar12 + RVar11;
    auVar1 = vfmadd213sd_fma(auVar18,auVar30,auVar6);
    local_518 = auVar1._0_8_;
  }
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_4f8,
             &(this_00->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  ChMaterialBeamANCF::Get_D
            ((ChMaterialBeamANCF *)local_4f8._0_8_,(ChMatrixNM<double,_6,_6> *)local_380);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4f8 + 8));
  local_4f8._8_8_ = &local_540;
  local_4f8._0_8_ = (element_type *)local_380;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_4b0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)local_4f8);
  auVar10._8_8_ = local_4b0.m_outerStride;
  auVar10._0_8_ = local_4b0.m_startCol.m_value;
  auVar33._8_8_ = local_4b0.m_xpr;
  auVar33._0_8_ = local_4b0.m_xpr;
  auVar33._16_8_ = local_4b0.m_xpr;
  auVar33._24_8_ = local_4b0.m_xpr;
  local_3f8._0_8_ = &local_3c8;
  local_4f8._0_8_ =
       local_4b0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  auVar9._8_8_ = local_4b0.m_startCol.m_value;
  auVar9._0_8_ = local_4b0.m_startRow.m_value;
  local_4d8.m_value =
       local_4b0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>._8_8_;
  auVar1 = vunpcklpd_avx(auVar9,auVar10);
  auVar33 = vblendpd_avx(ZEXT1632(auVar1),auVar33,8);
  local_4d0 = vpermpd_avx2(auVar33,0xc4);
  unique0x00104880 = vshufpd_avx(auVar10,auVar10,1);
  local_4e0.m_value = local_4b0.m_outerStride;
  local_3f8._8_8_ =
       (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
        *)local_4f8;
  local_3e8 = (Matrix<double,_3,_3,_0,_3,_3> *)local_3f8._0_8_;
  local_478 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                        ((Matrix<double,_3,_3,_0,_3,_3> *)local_3f8._0_8_);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&local_428,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
               *)local_3f8,&local_478);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_470,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_428);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_470._8_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = ((double)local_450.m_value - local_430) * ((double)local_450.m_value - local_430);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (double)local_470._0_8_ - (double)local_450.m_value;
  auVar1 = vfmadd231sd_fma(auVar19,auVar34,auVar34);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_430 - (double)local_470._0_8_;
  auVar1 = vfmadd213sd_fma(auVar31,auVar31,auVar1);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_448;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_440 * local_440;
  auVar2 = vfmadd231sd_fma(auVar35,auVar20,auVar20);
  auVar2 = vfmadd231sd_fma(auVar2,auVar32,auVar32);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar2._0_8_ * 3.0;
  auVar1 = vfmadd231sd_fma(auVar21,auVar1,ZEXT816(0x3fe0000000000000));
  if (auVar1._0_8_ < 0.0) {
    dVar15 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar15 = auVar1._0_8_;
  }
  return dVar15;
}

Assistant:

double ChElementBeamANCF_3333::GetVonMissesStress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}